

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_add_exts(nt_opts *opts)

{
  long lVar1;
  long lVar2;
  mat44 *pmVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  int local_3c;
  int local_38;
  int elen;
  int ec;
  int fc;
  char *edata;
  char *ext;
  nifti_image *nim;
  nt_opts *opts_local;
  
  _ec = (char *)0x0;
  nim = (nifti_image *)opts;
  if (2 < g_debug) {
    fprintf(_stderr,"+d adding %d extensions to %d files...\n   extension types are: ",
            (ulong)(uint)(opts->elist).len,(ulong)(uint)(opts->infiles).len);
    disp_raw_data(*(void **)&nim->quatern_d,8,(int)nim->quatern_b,' ',1);
  }
  lVar1._0_4_ = nim->phase_dim;
  lVar1._4_4_ = nim->slice_dim;
  if ((lVar1 == 0) || ((nim->qto_xyz).m[1][1] == 1.4013e-45)) {
    if (nim->slice_code < 1) {
      opts_local._4_4_ = 0;
    }
    else {
      for (elen = 0; elen < (int)(nim->qto_xyz).m[1][1]; elen = elen + 1) {
        ext = (char *)nt_image_read((nt_opts *)nim,
                                    *(char **)(*(long *)((nim->qto_xyz).m[1] + 3) + (long)elen * 8),
                                    1);
        if ((nifti_image *)ext == (nifti_image *)0x0) {
          return 1;
        }
        for (local_38 = 0; pcVar4 = ext, local_38 < nim->slice_code; local_38 = local_38 + 1) {
          edata = *(char **)(*(long *)&nim->slice_end + (long)local_38 * 8);
          sVar6 = strlen(edata);
          local_3c = (int)sVar6;
          iVar5 = strncmp(edata,"file:",5);
          pcVar4 = edata;
          if ((iVar5 == 0) &&
             ((_ec = read_file_text(edata + 5,&local_3c), _ec == (char *)0x0 ||
              (pcVar4 = _ec, local_3c < 1)))) {
            fprintf(_stderr,"** failed to read extension data from \'%s\'\n",edata + 5);
          }
          else {
            edata = pcVar4;
            iVar5 = nifti_add_extension((nifti_image *)ext,edata,local_3c,
                                        *(int *)(*(long *)&nim->quatern_d + (long)local_38 * 4));
            if (iVar5 != 0) {
              nifti_image_free((nifti_image *)ext);
              return 1;
            }
            if (_ec != (char *)0x0) {
              free(_ec);
              _ec = (char *)0x0;
            }
          }
        }
        if (nim->sform_code != 0) {
          pmVar3 = &nim->qto_xyz;
          sVar6 = strlen((char *)((nim->qto_xyz).m[2] + 1));
          iVar5 = nifti_add_extension((nifti_image *)pcVar4,(char *)(pmVar3->m[2] + 1),(int)sVar6,6)
          ;
          if (iVar5 != 0) {
            fprintf(_stderr,"** failed to add command to image as extension\n");
          }
        }
        lVar2._0_4_ = nim->phase_dim;
        lVar2._4_4_ = nim->slice_dim;
        if ((lVar2 != 0) &&
           (iVar5 = nifti_set_filenames((nifti_image *)ext,*(char **)&nim->phase_dim,
                                        (uint)((nim->freq_dim != 0 ^ 0xffU) & 1),1), iVar5 != 0)) {
          nifti_image_free((nifti_image *)ext);
          return 1;
        }
        if (1 < g_debug) {
          fprintf(_stderr,"+d writing %s with %d new extension(s)\n",
                  *(undefined8 *)(*(long *)((nim->qto_xyz).m[1] + 3) + (long)elen * 8),
                  (ulong)(uint)nim->slice_code);
        }
        nifti_image_write((nifti_image *)ext);
        nifti_image_free((nifti_image *)ext);
      }
      if (0 < g_debug) {
        fprintf(_stderr,"+d added %d extension(s) to %d files\n",(ulong)(uint)nim->slice_code,
                (ulong)(uint)(nim->qto_xyz).m[1][1]);
      }
      opts_local._4_4_ = 0;
    }
  }
  else {
    fprintf(_stderr,"** error: we have a prefix but %d files\n",(ulong)(uint)(nim->qto_xyz).m[1][1])
    ;
    opts_local._4_4_ = 1;
  }
  return opts_local._4_4_;
}

Assistant:

int act_add_exts( nt_opts * opts )
{
   nifti_image      * nim;
   char             * ext, * edata = NULL;
   int                fc, ec, elen;

   if( g_debug > 2 ){
      fprintf(stderr,"+d adding %d extensions to %d files...\n"
                     "   extension types are: ",
              opts->elist.len, opts->infiles.len);
      disp_raw_data(opts->etypes.list, DT_INT32, opts->etypes.len, ' ', 1);
   }

   if( opts->prefix && opts->infiles.len != 1 ){
      fprintf(stderr,"** error: we have a prefix but %d files\n",
              opts->infiles.len);
      return 1;
   }

   if( opts->elist.len <= 0 ) return 0;

   for( fc = 0; fc < opts->infiles.len; fc++ )
   {
      nim = nt_image_read( opts, opts->infiles.list[fc], 1 );
      if( !nim ) return 1;  /* errors come from the library */

      for( ec = 0; ec < opts->elist.len; ec++ ){
         ext = opts->elist.list[ec];
         elen = strlen(ext);
         if( !strncmp(ext,"file:",5) ){
            edata = read_file_text(ext+5, &elen);
            if( !edata || elen <= 0 ) {
               fprintf(stderr,"** failed to read extension data from '%s'\n",
                       ext+5);
               continue;
            }
            ext = edata;
         }

         if( nifti_add_extension(nim, ext, elen, opts->etypes.list[ec]) ){
            nifti_image_free(nim);
            return 1;
         }

         /* if extension came from file, free the data */
         if( edata ){ free(edata); edata = NULL; }
      }

      if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                             strlen(opts->command), NIFTI_ECODE_COMMENT) )
         fprintf(stderr,"** failed to add command to image as extension\n");

      if( opts->prefix &&
          nifti_set_filenames(nim, opts->prefix, !opts->overwrite, 1) )
      {
         nifti_image_free(nim);
         return 1;
      }

      if( g_debug > 1 )
         fprintf(stderr,"+d writing %s with %d new extension(s)\n",
                 opts->infiles.list[fc], opts->elist.len);

      nifti_image_write(nim);
      nifti_image_free(nim);
   }

   if( g_debug > 0 )
      fprintf(stderr,"+d added %d extension(s) to %d files\n",
              opts->elist.len, opts->infiles.len);

   return 0;
}